

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O1

void __thiscall crnlib::qdxt5::clear(qdxt5 *this)

{
  uint uVar1;
  vector<unsigned_int> *pvVar2;
  void *pvVar3;
  raw_node *prVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  vector<crnlib::vector<unsigned_int>_> *pvVar8;
  long lVar9;
  uint i;
  
  this->m_main_thread_id = 0;
  *(undefined8 *)&this->m_num_blocks = 0;
  *(undefined8 *)((long)&this->m_pBlocks + 4) = 0;
  *(undefined8 *)((long)&this->m_pDst_elements + 4) = 0;
  (this->m_params).m_quality_level = 0xff;
  (this->m_params).m_dxt_quality = cCRNDXTQualityUber;
  (this->m_params).m_num_mips = 0;
  (this->m_params).m_pProgress_func = (progress_callback_func)0x0;
  (this->m_params).m_pProgress_data = (void *)0x0;
  (this->m_params).m_hierarchical = true;
  memset((this->m_params).m_mip_desc,0,0x600);
  (this->m_params).m_comp_index = 3;
  (this->m_params).m_progress_start = 0;
  (this->m_params).m_progress_range = 100;
  (this->m_params).m_use_both_block_types = true;
  clusterizer<crnlib::vec<2U,_float>_>::clear(&this->m_endpoint_clusterizer);
  pvVar2 = (this->m_endpoint_cluster_indices).m_p;
  if (pvVar2 != (vector<unsigned_int> *)0x0) {
    uVar7 = (ulong)(this->m_endpoint_cluster_indices).m_size;
    if (uVar7 != 0) {
      lVar9 = 0;
      do {
        pvVar3 = *(void **)((long)&pvVar2->m_p + lVar9);
        if (pvVar3 != (void *)0x0) {
          crnlib_free(pvVar3);
        }
        lVar9 = lVar9 + 0x10;
      } while (uVar7 << 4 != lVar9);
    }
    crnlib_free((this->m_endpoint_cluster_indices).m_p);
    (this->m_endpoint_cluster_indices).m_p = (vector<unsigned_int> *)0x0;
    (this->m_endpoint_cluster_indices).m_size = 0;
    (this->m_endpoint_cluster_indices).m_capacity = 0;
  }
  this->m_max_selector_clusters = 0;
  this->m_canceled = false;
  this->m_progress_start = 0;
  this->m_progress_range = 100;
  lVar9 = 0;
  do {
    clusterizer<crnlib::vec<16U,_float>_>::clear
              ((clusterizer<crnlib::vec<16U,_float>_> *)
               ((long)&(this->m_selector_clusterizer).m_clusterizers[0].m_training_vecs.m_p + lVar9)
              );
    lVar9 = lVar9 + 0x70;
  } while (lVar9 != 0x1c0);
  lVar9 = 0;
  do {
    pvVar2 = this->m_cached_selector_cluster_indices[lVar9].m_p;
    if (pvVar2 != (vector<unsigned_int> *)0x0) {
      pvVar8 = this->m_cached_selector_cluster_indices + lVar9;
      uVar1 = pvVar8->m_size;
      if ((ulong)uVar1 != 0) {
        lVar5 = 0;
        do {
          pvVar3 = *(void **)((long)&pvVar2->m_p + lVar5);
          if (pvVar3 != (void *)0x0) {
            crnlib_free(pvVar3);
          }
          lVar5 = lVar5 + 0x10;
        } while ((ulong)uVar1 << 4 != lVar5);
      }
      crnlib_free(pvVar8->m_p);
      pvVar8->m_p = (vector<unsigned_int> *)0x0;
      pvVar8->m_size = 0;
      pvVar8->m_capacity = 0;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 0x100);
  uVar7 = (ulong)(this->m_cluster_hash).m_values.m_size;
  if (uVar7 != 0) {
    prVar4 = (this->m_cluster_hash).m_values.m_p;
    uVar6 = (this->m_cluster_hash).m_num_valid;
    lVar9 = 0;
    do {
      if (prVar4[lVar9 + 0x1c] != (raw_node)0x0) {
        pvVar3 = *(void **)(prVar4 + lVar9);
        if (pvVar3 != (void *)0x0) {
          crnlib_free(pvVar3);
        }
        uVar6 = uVar6 - 1;
        if (uVar6 == 0) break;
      }
      lVar9 = lVar9 + 0x20;
    } while (uVar7 << 5 != lVar9);
    prVar4 = (this->m_cluster_hash).m_values.m_p;
    if (prVar4 != (raw_node *)0x0) {
      crnlib_free(prVar4);
      (this->m_cluster_hash).m_values.m_p = (raw_node *)0x0;
      (this->m_cluster_hash).m_values.m_size = 0;
      (this->m_cluster_hash).m_values.m_capacity = 0;
    }
    (this->m_cluster_hash).m_hash_shift = 0x20;
    (this->m_cluster_hash).m_num_valid = 0;
    (this->m_cluster_hash).m_grow_threshold = 0;
  }
  this->m_prev_percentage_complete = -1;
  return;
}

Assistant:

void qdxt5::clear()
    {
        m_main_thread_id = 0;
        m_num_blocks = 0;
        m_pBlocks = 0;
        m_pDst_elements = nullptr;
        m_elements_per_block = 0;
        m_params.clear();
        m_endpoint_clusterizer.clear();
        m_endpoint_cluster_indices.clear();
        m_max_selector_clusters = 0;
        m_canceled = false;
        m_progress_start = 0;
        m_progress_range = 100;
        m_selector_clusterizer.clear();

        for (uint i = 0; i <= qdxt5_params::cMaxQuality; i++)
        {
            m_cached_selector_cluster_indices[i].clear();
        }

        m_cluster_hash.clear();

        m_prev_percentage_complete = -1;
    }